

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Bool prvTidySetXHTMLDocType(TidyDocImpl *doc)

{
  Lexer *pLVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  tmbstr ptVar5;
  ctmbstr ptVar6;
  AttVal *pAVar7;
  ctmbstr sys;
  ctmbstr pub;
  Node *pNStack_28;
  TidyDoctypeModes dtmode;
  Node *doctype;
  Lexer *lexer;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  pNStack_28 = prvTidyFindDocType(doc);
  uVar2 = (doc->config).value[0xe].v;
  iVar3 = (int)uVar2;
  uVar4 = prvTidyApparentVersion(doc);
  pLVar1->versionEmitted = uVar4;
  if (iVar3 == 1) {
    if (pNStack_28 != (Node *)0x0) {
      prvTidyDiscardElement(doc,pNStack_28);
    }
    doc_local._4_4_ = yes;
  }
  else if ((iVar3 == 5) && ((doc->config).value[0xd].v == 0)) {
    doc_local._4_4_ = no;
  }
  else {
    if (pNStack_28 == (Node *)0x0) {
      pNStack_28 = NewDocTypeNode(doc);
      ptVar5 = prvTidytmbstrdup(doc->allocator,"html");
      pNStack_28->element = ptVar5;
    }
    else {
      ptVar5 = prvTidytmbstrtolower(pNStack_28->element);
      pNStack_28->element = ptVar5;
    }
    switch(uVar2 & 0xffffffff) {
    case 0:
      prvTidyRepairAttrValue(doc,pNStack_28,"PUBLIC",(ctmbstr)0x0);
      prvTidyRepairAttrValue(doc,pNStack_28,"SYSTEM",(ctmbstr)0x0);
      pLVar1->versionEmitted = 0x40000;
      break;
    case 1:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/lexer.c"
                    ,0x7f5,"Bool prvTidySetXHTMLDocType(TidyDocImpl *)");
    case 2:
      if ((pLVar1->doctype == 0) || (pLVar1->doctype == 0x60000)) {
        pLVar1->versionEmitted = 0x40000;
        return yes;
      }
      if (((pLVar1->versions & 0x800) != 0) && (pLVar1->doctype == 0x800)) {
        pAVar7 = prvTidyGetAttrByName(pNStack_28,"SYSTEM");
        if (pAVar7 == (AttVal *)0x0) {
          ptVar6 = GetSIFromVers(0x800);
          prvTidyRepairAttrValue(doc,pNStack_28,"SYSTEM",ptVar6);
        }
        pLVar1->versionEmitted = 0x800;
        return yes;
      }
      if (((pLVar1->versions & 0x800) == 0) || ((pLVar1->versions & 0x7fc) != 0)) {
        if (((pLVar1->versions & 0x1000) != 0) && (pLVar1->doctype == 0x1000)) {
          pAVar7 = prvTidyGetAttrByName(pNStack_28,"SYSTEM");
          if (pAVar7 == (AttVal *)0x0) {
            ptVar6 = GetSIFromVers(0x1000);
            prvTidyRepairAttrValue(doc,pNStack_28,"SYSTEM",ptVar6);
          }
          pLVar1->versionEmitted = 0x1000;
          return yes;
        }
        if ((pLVar1->versions & 0x124) == 0) {
          if ((pLVar1->versions & 0x490) == 0) {
            if ((pLVar1->versions & 0x6db) == 0) {
              if ((pLVar1->versions & 0x60000) == 0) {
                if (pNStack_28 != (Node *)0x0) {
                  prvTidyDiscardElement(doc,pNStack_28);
                }
                return no;
              }
            }
            else {
              ptVar6 = GetFPIFromVers(0x200);
              prvTidyRepairAttrValue(doc,pNStack_28,"PUBLIC",ptVar6);
              ptVar6 = GetSIFromVers(0x200);
              prvTidyRepairAttrValue(doc,pNStack_28,"SYSTEM",ptVar6);
              pLVar1->versionEmitted = 0x200;
            }
          }
          else {
            ptVar6 = GetFPIFromVers(0x400);
            prvTidyRepairAttrValue(doc,pNStack_28,"PUBLIC",ptVar6);
            ptVar6 = GetSIFromVers(0x400);
            prvTidyRepairAttrValue(doc,pNStack_28,"SYSTEM",ptVar6);
            pLVar1->versionEmitted = 0x400;
          }
        }
        else {
          ptVar6 = GetFPIFromVers(0x100);
          prvTidyRepairAttrValue(doc,pNStack_28,"PUBLIC",ptVar6);
          ptVar6 = GetSIFromVers(0x100);
          prvTidyRepairAttrValue(doc,pNStack_28,"SYSTEM",ptVar6);
          pLVar1->versionEmitted = 0x100;
        }
      }
      else {
        ptVar6 = GetFPIFromVers(0x800);
        prvTidyRepairAttrValue(doc,pNStack_28,"PUBLIC",ptVar6);
        ptVar6 = GetSIFromVers(0x800);
        prvTidyRepairAttrValue(doc,pNStack_28,"SYSTEM",ptVar6);
        pLVar1->versionEmitted = 0x800;
      }
      break;
    case 3:
      ptVar6 = GetFPIFromVers(0x100);
      prvTidyRepairAttrValue(doc,pNStack_28,"PUBLIC",ptVar6);
      ptVar6 = GetSIFromVers(0x100);
      prvTidyRepairAttrValue(doc,pNStack_28,"SYSTEM",ptVar6);
      pLVar1->versionEmitted = 0x100;
      break;
    case 4:
      ptVar6 = GetFPIFromVers(0x200);
      prvTidyRepairAttrValue(doc,pNStack_28,"PUBLIC",ptVar6);
      ptVar6 = GetSIFromVers(0x200);
      prvTidyRepairAttrValue(doc,pNStack_28,"SYSTEM",ptVar6);
      pLVar1->versionEmitted = 0x200;
      break;
    case 5:
      prvTidyRepairAttrValue(doc,pNStack_28,"PUBLIC",(doc->config).value[0xd].p);
      prvTidyRepairAttrValue(doc,pNStack_28,"SYSTEM","");
    }
    doc_local._4_4_ = no;
  }
  return doc_local._4_4_;
}

Assistant:

Bool TY_(SetXHTMLDocType)( TidyDocImpl* doc )
{
    Lexer *lexer = doc->lexer;
    Node *doctype = TY_(FindDocType)( doc );
    TidyDoctypeModes dtmode = (TidyDoctypeModes)cfg(doc, TidyDoctypeMode);
    ctmbstr pub = "PUBLIC";
    ctmbstr sys = "SYSTEM";

    lexer->versionEmitted = TY_(ApparentVersion)( doc );

    if (dtmode == TidyDoctypeOmit)
    {
        if (doctype)
            TY_(DiscardElement)(doc, doctype);
        return yes;
    }

    if (dtmode == TidyDoctypeUser && !cfgStr(doc, TidyDoctype))
        return no;

    if (!doctype)
    {
        doctype = NewDocTypeNode(doc);
        doctype->element = TY_(tmbstrdup)(doc->allocator, "html");
    }
    else
    {
        doctype->element = TY_(tmbstrtolower)(doctype->element);
    }

    switch(dtmode)
    {
    case TidyDoctypeHtml5:
        /* HTML5 */
        TY_(RepairAttrValue)(doc, doctype, pub, NULL);
        TY_(RepairAttrValue)(doc, doctype, sys, NULL);
        lexer->versionEmitted = XH50;
        break;
    case TidyDoctypeStrict:
        /* XHTML 1.0 Strict */
        TY_(RepairAttrValue)(doc, doctype, pub, GetFPIFromVers(X10S));
        TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(X10S));
        lexer->versionEmitted = X10S;
        break;
    case TidyDoctypeLoose:
        /* XHTML 1.0 Transitional */
        TY_(RepairAttrValue)(doc, doctype, pub, GetFPIFromVers(X10T));
        TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(X10T));
        lexer->versionEmitted = X10T;
        break;
    case TidyDoctypeUser:
        /* user defined document type declaration */
        TY_(RepairAttrValue)(doc, doctype, pub, cfgStr(doc, TidyDoctype));
        TY_(RepairAttrValue)(doc, doctype, sys, "");
        break;
    case TidyDoctypeAuto:
        if (lexer->doctype == VERS_UNKNOWN || lexer->doctype == VERS_HTML5) {
          lexer->versionEmitted = XH50;
          return yes;
        }
        else if (lexer->versions & XH11 && lexer->doctype == XH11)
        {
            if (!TY_(GetAttrByName)(doctype, sys))
                TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(XH11));
            lexer->versionEmitted = XH11;
            return yes;
        }
        else if (lexer->versions & XH11 && !(lexer->versions & VERS_HTML40))
        {
            TY_(RepairAttrValue)(doc, doctype, pub, GetFPIFromVers(XH11));
            TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(XH11));
            lexer->versionEmitted = XH11;
        }
        else if (lexer->versions & XB10 && lexer->doctype == XB10)
        {
            if (!TY_(GetAttrByName)(doctype, sys))
                TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(XB10));
            lexer->versionEmitted = XB10;
            return yes;
        }
        else if (lexer->versions & VERS_HTML40_STRICT)
        {
            TY_(RepairAttrValue)(doc, doctype, pub, GetFPIFromVers(X10S));
            TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(X10S));
            lexer->versionEmitted = X10S;
        }
        else if (lexer->versions & VERS_FRAMESET)
        {
            TY_(RepairAttrValue)(doc, doctype, pub, GetFPIFromVers(X10F));
            TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(X10F));
            lexer->versionEmitted = X10F;
        }
        else if (lexer->versions & VERS_LOOSE)
        {
            TY_(RepairAttrValue)(doc, doctype, pub, GetFPIFromVers(X10T));
            TY_(RepairAttrValue)(doc, doctype, sys, GetSIFromVers(X10T));
            lexer->versionEmitted = X10T;
        }
        else if (lexer->versions & VERS_HTML5)
        {
            /*\
             *  Issue #273 - If still a html5/xhtml5 bit
             *  existing, that is the 'ConstrainVersion' has
             *  not eliminated all HTML5, then nothing to do here.
             *  Certainly do **not** delete the DocType node!
             *  see: http://www.w3.org/QA/Tips/Doctype
            \*/
        }
        else
        {
            if (doctype)
                TY_(DiscardElement)(doc, doctype);
            return no;
        }
        break;
    case TidyDoctypeOmit:
        assert(0);
        break;
    }

    return no;
}